

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode cf_socket_open(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_sockaddr_ex *addr;
  uint *sockfd;
  undefined1 *puVar1;
  ushort uVar2;
  uchar uVar3;
  void *pvVar4;
  void *pvVar5;
  connectdata *pcVar6;
  char *pcVar7;
  _Bool _Var8;
  uchar uVar9;
  if2ip_result_t iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  if2ip_result_t iVar14;
  resolve_t rVar15;
  uint *puVar16;
  curl_trc_feat *pcVar17;
  size_t sVar18;
  char *pcVar19;
  int *piVar20;
  ushort uVar21;
  socklen_t sVar22;
  char *pcVar23;
  char *__s;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  curltime cVar27;
  Curl_dns_entry *h;
  int on;
  curl_off_t scope_id;
  Curl_sockaddr_storage sa;
  char buffer [256];
  curl_socklen_t onoff;
  socklen_t local_310;
  Curl_dns_entry *local_2e8;
  char *local_2e0;
  Curl_cfilter *local_2d8;
  uint local_2d0;
  undefined4 local_2cc;
  char *local_2c8;
  undefined4 local_2c0 [2];
  sockaddr local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  char local_238 [256];
  char *local_138 [33];
  
  pvVar4 = cf->ctx;
  cVar27 = Curl_now();
  *(time_t *)((long)pvVar4 + 0x100) = cVar27.tv_sec;
  *(int *)((long)pvVar4 + 0x108) = cVar27.tv_usec;
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    *(byte *)((long)pvVar4 + 0xd) = *(byte *)((long)pvVar4 + 0xd) | 8;
  }
  addr = (Curl_sockaddr_ex *)((long)pvVar4 + 8);
  sockfd = (uint *)((long)pvVar4 + 0x98);
  iVar10 = socket_open(data,addr,(curl_socket_t *)sockfd);
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    *(byte *)((long)pvVar4 + 0xd) = *(byte *)((long)pvVar4 + 0xd) & 0xf7;
  }
  if (iVar10 != IF2IP_NOT_FOUND) {
    bVar25 = false;
    goto LAB_00118591;
  }
  pvVar5 = cf->ctx;
  local_2d8 = cf;
  _Var8 = Curl_addr2string((sockaddr *)((long)pvVar5 + 0x18),
                           *(curl_socklen_t *)((long)pvVar5 + 0x14),(char *)((long)pvVar5 + 0x9c),
                           (int *)((long)pvVar5 + 0xf8));
  cf = local_2d8;
  if (!_Var8) {
    puVar16 = (uint *)__errno_location();
    *(uint *)((long)pvVar5 + 0x130) = *puVar16;
    uVar24 = *puVar16;
    Curl_strerror(uVar24,local_238,0x100);
    Curl_failf(data,"curl_sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar24);
    bVar25 = false;
    cf = local_2d8;
    iVar10 = IF2IP_FOUND;
    goto LAB_00118591;
  }
  if (addr->family == 10) {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) {
      pcVar17 = (data->state).feat;
      pcVar23 = "  Trying [%s]:%d...";
LAB_00117c51:
      if ((pcVar17 == (curl_trc_feat *)0x0) || (0 < pcVar17->log_level)) {
        Curl_infof(data,pcVar23,(long)pvVar4 + 0x9c);
      }
    }
  }
  else if ((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) {
    pcVar17 = (data->state).feat;
    pcVar23 = "  Trying %s:%d...";
    goto LAB_00117c51;
  }
  if ((addr->family | 8U) == 10) {
    bVar25 = *(int *)((long)pvVar4 + 0xc) == 1;
  }
  else {
    bVar25 = false;
  }
  if (bVar25) {
    if (((data->set).field_0x898 & 4) != 0) {
      local_138[0] = (char *)CONCAT44(local_138[0]._4_4_,1);
      iVar11 = setsockopt(*sockfd,6,1,local_138,4);
      if ((((data != (Curl_easy *)0x0) && (iVar11 < 0)) && (((data->set).field_0x897 & 0x40) != 0))
         && ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
             (0 < pcVar17->log_level)))) {
        piVar20 = __errno_location();
        pcVar23 = Curl_strerror(*piVar20,local_238,0x100);
        Curl_infof(data,"Could not set TCP_NODELAY: %s",pcVar23);
      }
    }
    if ((bVar25) && (((data->set).field_0x899 & 1) != 0)) {
      tcpkeepalive(data,*sockfd);
    }
  }
  if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_00117cff:
    bVar25 = false;
  }
  else {
    Curl_set_in_callback(data,true);
    iVar11 = (*(data->set).fsockopt)((data->set).sockopt_client,*sockfd,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data,false);
    if (iVar11 != 2) {
      if (iVar11 != 0) {
        bVar25 = false;
        iVar10 = 0x2a;
        goto LAB_00118591;
      }
      goto LAB_00117cff;
    }
    bVar25 = true;
  }
  uVar24 = addr->family;
  if ((uVar24 | 8) == 10) {
    pcVar6 = cf->conn;
    iVar11 = *(int *)((long)pvVar4 + 0x98);
    uVar12 = Curl_ipv6_scope((sockaddr *)((long)pvVar4 + 0x18));
    local_2e8 = (Curl_dns_entry *)0x0;
    uVar21 = (data->set).localport;
    local_2d0 = (uint)(data->set).localportrange;
    pcVar23 = (data->set).str[0x1e];
    pcVar19 = (data->set).str[0x1f];
    pcVar7 = (data->set).str[0x20];
    __s = pcVar19;
    if (pcVar19 == (char *)0x0) {
      __s = pcVar23;
    }
    if (pcVar7 != (char *)0x0) {
      pcVar23 = pcVar7;
    }
    local_2cc = 1;
    iVar14 = IF2IP_NOT_FOUND;
    if (uVar21 != 0 || (__s != (char *)0x0 || pcVar23 != (char *)0x0)) {
      local_2e0 = pcVar19;
      local_2c8 = pcVar23;
      if (__s != (char *)0x0) {
        sVar18 = strlen(__s);
        iVar14 = 0x2b;
        if (0xfe < sVar18) goto LAB_0011851e;
      }
      local_248 = 0;
      uStack_240 = 0;
      local_258 = 0;
      uStack_250 = 0;
      local_268 = 0;
      uStack_260 = 0;
      local_278 = 0;
      uStack_270 = 0;
      local_288 = 0;
      uStack_280 = 0;
      local_298 = 0;
      uStack_290 = 0;
      local_2a8 = 0;
      uStack_2a0 = 0;
      local_2b8.sa_family = 0;
      local_2b8.sa_data[0] = '\0';
      local_2b8.sa_data[1] = '\0';
      local_2b8.sa_data[2] = '\0';
      local_2b8.sa_data[3] = '\0';
      local_2b8.sa_data[4] = '\0';
      local_2b8.sa_data[5] = '\0';
      local_2b8.sa_data[6] = '\0';
      local_2b8.sa_data[7] = '\0';
      local_2b8.sa_data[8] = '\0';
      local_2b8.sa_data[9] = '\0';
      local_2b8.sa_data[10] = '\0';
      local_2b8.sa_data[0xb] = '\0';
      local_2b8.sa_data[0xc] = '\0';
      local_2b8.sa_data[0xd] = '\0';
      if (__s == (char *)0x0 && pcVar23 == (char *)0x0) {
        if (uVar24 == 10) {
          local_310 = 0x1c;
          local_2b8.sa_family = 10;
LAB_0011801c:
          local_2b8.sa_data._0_2_ = uVar21 << 8 | uVar21 >> 8;
          local_2b8.sa_data._2_4_ = 0;
        }
        else {
          local_310 = 0;
          if (uVar24 == 2) {
            local_310 = 0x10;
            local_2b8.sa_family = 2;
            goto LAB_0011801c;
          }
        }
      }
      else {
        iVar14 = IF2IP_NOT_FOUND;
        memset(local_238,0,0x100);
        if (__s == (char *)0x0) {
LAB_00117f20:
          if (pcVar7 == (char *)0x0) {
            iVar14 = Curl_if2ip(uVar24,uVar12,pcVar6->scope_id,__s,local_238,0x100);
          }
          if (iVar14 == IF2IP_FOUND) {
            local_310 = 1;
            if (((data == (Curl_easy *)0x0) || (((data->set).field_0x897 & 0x40) == 0)) ||
               ((pcVar17 = (data->state).feat, pcVar17 != (curl_trc_feat *)0x0 &&
                (pcVar17->log_level < 1)))) {
              pcVar23 = local_238;
            }
            else {
              Curl_infof(data,"Local Interface %s is ip %s using address family %i",__s,local_238,
                         (ulong)uVar24);
              pcVar23 = local_238;
            }
LAB_001180b7:
            sVar22 = local_310;
            if (local_2e0 == (char *)0x0 || pcVar7 != (char *)0x0) {
              uVar3 = pcVar6->ip_version;
              if (uVar24 == 2) {
                uVar9 = '\x01';
LAB_00118109:
                pcVar6->ip_version = uVar9;
              }
              else if (uVar24 == 10) {
                uVar9 = '\x02';
                goto LAB_00118109;
              }
              rVar15 = Curl_resolv(data,pcVar23,0x50,false,&local_2e8);
              if (rVar15 == CURLRESOLV_PENDING) {
                Curl_resolver_wait_resolv(data,&local_2e8);
              }
              pcVar6->ip_version = uVar3;
              if (local_2e8 == (Curl_dns_entry *)0x0) {
                bVar26 = true;
                local_310 = 0xffffffff;
              }
              else {
                uVar12 = local_2e8->addr->ai_family;
                Curl_printable_address(local_2e8->addr,local_238,0x100);
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
                   ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar17->log_level)))) {
                  Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",pcVar23,
                             (ulong)uVar24,local_238,(ulong)uVar12);
                }
                Curl_resolv_unlink(data,&local_2e8);
                bVar26 = uVar12 == uVar24;
                if (bVar26) {
                  local_310 = 1;
                }
              }
              sVar22 = local_310;
              if (!bVar26) {
                iVar14 = IF2IP_AF_NOT_SUPPORTED;
                goto LAB_001182c3;
              }
            }
            local_310 = 0;
            if (0 < (int)sVar22) {
              local_310 = 0;
              if (uVar24 == 2) {
                iVar13 = inet_pton(2,local_238,local_2b8.sa_data + 2);
                if (0 < iVar13) {
                  local_2b8.sa_data._0_2_ = uVar21 << 8 | uVar21 >> 8;
                  local_2b8.sa_family = 2;
                  local_310 = 0x10;
                }
              }
              else if (uVar24 == 10) {
                pcVar19 = strchr(local_238,0x25);
                local_138[0] = pcVar19;
                if (pcVar19 != (char *)0x0) {
                  local_138[0] = pcVar19 + 1;
                  *pcVar19 = '\0';
                }
                iVar13 = inet_pton(10,local_238,local_2b8.sa_data + 6);
                local_310 = 0x1c;
                bVar26 = true;
                if (0 < iVar13) {
                  local_2b8.sa_data._0_2_ = uVar21 << 8 | uVar21 >> 8;
                  local_2b8.sa_family = 10;
                  if (local_138[0] != (char *)0x0) {
                    iVar13 = Curl_str_number(local_138,(curl_off_t *)local_2c0,0xffffffff);
                    if (iVar13 == 0) {
                      uStack_2a0 = CONCAT44(uStack_2a0._4_4_,local_2c0[0]);
                    }
                    else {
                      bVar26 = false;
                      local_310 = 0;
                    }
                  }
                }
                if (!bVar26) {
                  iVar14 = IF2IP_AF_NOT_SUPPORTED;
                  goto LAB_001183d9;
                }
              }
            }
            if ((int)sVar22 < 1) {
              puVar1 = &(data->state).field_0x7be;
              *puVar1 = *puVar1 & 0xdf;
              puVar16 = (uint *)__errno_location();
              uVar24 = *puVar16;
              (data->state).os_errno = uVar24;
              pcVar19 = Curl_strerror(uVar24,(char *)local_138,0x100);
              bVar26 = false;
              Curl_failf(data,"Couldn\'t bind to \'%s\' with errno %d: %s",pcVar23,(ulong)uVar24,
                         pcVar19);
              iVar14 = 0x2d;
            }
            else {
              iVar14 = IF2IP_AF_NOT_SUPPORTED;
              bVar26 = true;
            }
          }
          else {
            local_310 = 0;
            if (iVar14 == IF2IP_AF_NOT_SUPPORTED) {
LAB_001183d9:
              bVar26 = false;
            }
            else {
              pcVar23 = local_2c8;
              if ((iVar14 != IF2IP_NOT_FOUND) || (local_2e0 == (char *)0x0 || pcVar7 != (char *)0x0)
                 ) goto LAB_001180b7;
              puVar16 = (uint *)__errno_location();
              uVar24 = *puVar16;
              (data->state).os_errno = uVar24;
              pcVar23 = Curl_strerror(uVar24,(char *)local_138,0x100);
              Curl_failf(data,"Couldn\'t bind to interface \'%s\' with errno %d: %s",__s,
                         (ulong)uVar24,pcVar23);
              iVar14 = 0x2d;
LAB_001182c3:
              bVar26 = false;
              local_310 = 0;
            }
          }
        }
        else {
          sVar18 = strlen(__s);
          iVar13 = setsockopt(iVar11,1,0x19,__s,(int)sVar18 + 1);
          cf = local_2d8;
          if (iVar13 != 0 || pcVar7 != (char *)0x0) goto LAB_00117f20;
          if (data == (Curl_easy *)0x0) {
LAB_001180f7:
            bVar26 = false;
            local_310 = 0;
            iVar14 = IF2IP_NOT_FOUND;
          }
          else {
            bVar26 = false;
            local_310 = 0;
            iVar14 = IF2IP_NOT_FOUND;
            if (((data->set).field_0x897 & 0x40) != 0) {
              pcVar17 = (data->state).feat;
              if ((pcVar17 == (curl_trc_feat *)0x0) || (0 < pcVar17->log_level)) {
                Curl_infof(data,"socket successfully bound to interface \'%s\'",__s);
              }
              goto LAB_001180f7;
            }
          }
        }
        if (!bVar26) goto LAB_0011851e;
      }
      setsockopt(iVar11,0,0x18,&local_2cc,4);
      iVar13 = bind(iVar11,&local_2b8,local_310);
      uVar2 = uVar21;
      uVar24 = local_2d0;
      while (iVar13 < 0) {
        uVar21 = uVar21 + 1;
        if (((int)uVar24 < 2) || (uVar21 == 0)) {
          puVar16 = (uint *)__errno_location();
          uVar24 = *puVar16;
          (data->state).os_errno = uVar24;
          pcVar23 = Curl_strerror(uVar24,local_238,0x100);
          Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar24,pcVar23);
          iVar14 = 0x2d;
          goto LAB_0011851e;
        }
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
           ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 ||
            (0 < pcVar17->log_level)))) {
          Curl_infof(data,"Bind to local port %d failed, trying next",(ulong)(uVar21 - 1));
        }
        local_2b8.sa_data._0_2_ = uVar21 * 0x100 | uVar21 >> 8;
        iVar13 = bind(iVar11,&local_2b8,local_310);
        uVar2 = uVar2 + 1;
        uVar24 = uVar24 - 1;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
         ((pcVar17 = (data->state).feat, pcVar17 == (curl_trc_feat *)0x0 || (0 < pcVar17->log_level)
          ))) {
        Curl_infof(data,"Local port: %hu",(ulong)uVar2);
      }
      puVar1 = &(pcVar6->bits).field_0x2;
      *puVar1 = *puVar1 | 0x10;
      iVar14 = IF2IP_NOT_FOUND;
    }
LAB_0011851e:
    if (iVar14 != IF2IP_NOT_FOUND) {
      iVar10 = 7;
      if (iVar14 != IF2IP_AF_NOT_SUPPORTED) {
        iVar10 = iVar14;
      }
      goto LAB_00118591;
    }
  }
  if ((data->set).fopensocket != (curl_opensocket_callback)0x0) {
    iVar11 = curlx_nonblock(*sockfd,1);
    if (iVar11 < 0) {
      piVar20 = __errno_location();
      *(int *)((long)pvVar4 + 0x130) = *piVar20;
      iVar10 = IF2IP_AF_NOT_SUPPORTED;
      goto LAB_00118591;
    }
  }
  *(byte *)((long)pvVar4 + 0x134) =
       *(byte *)((long)pvVar4 + 0x134) & 0xf7 | (*(int *)((long)pvVar4 + 0xc) != 2) << 3;
  iVar10 = IF2IP_NOT_FOUND;
LAB_00118591:
  if (iVar10 == IF2IP_NOT_FOUND) {
    if (bVar25) {
      set_local_ip(cf,data);
      cVar27 = Curl_now();
      *(time_t *)((long)pvVar4 + 0x110) = cVar27.tv_sec;
      *(int *)((long)pvVar4 + 0x118) = cVar27.tv_usec;
      cf->field_0x24 = cf->field_0x24 | 1;
    }
  }
  else if (*sockfd != 0xffffffff) {
    socket_close(data,cf->conn,1,*sockfd);
    *sockfd = 0xffffffff;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) {
    pcVar17 = (data->state).feat;
    if (pcVar17 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) {
        return iVar10;
      }
    }
    else {
      if (cf == (Curl_cfilter *)0x0) {
        return iVar10;
      }
      if (pcVar17->log_level < 1) {
        return iVar10;
      }
    }
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"cf_socket_open() -> %d, fd=%d",(ulong)iVar10,(ulong)*sockfd);
    }
  }
  return iVar10;
}

Assistant:

static CURLcode cf_socket_open(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int error = 0;
  bool isconnected = FALSE;
  CURLcode result = CURLE_COULDNT_CONNECT;
  bool is_tcp;

  (void)data;
  DEBUGASSERT(ctx->sock == CURL_SOCKET_BAD);
  ctx->started_at = Curl_now();
#ifdef SOCK_NONBLOCK
  /* Do not tuck SOCK_NONBLOCK into socktype when opensocket callback is set
   * because we would not know how socketype is about to be used in the
   * callback, SOCK_NONBLOCK might get factored out before calling socket().
   */
  if(!data->set.fopensocket)
    ctx->addr.socktype |= SOCK_NONBLOCK;
#endif
  result = socket_open(data, &ctx->addr, &ctx->sock);
#ifdef SOCK_NONBLOCK
  /* Restore the socktype after the socket is created. */
  if(!data->set.fopensocket)
    ctx->addr.socktype &= ~SOCK_NONBLOCK;
#endif
  if(result)
    goto out;

  result = set_remote_ip(cf, data);
  if(result)
    goto out;

#ifdef USE_IPV6
  if(ctx->addr.family == AF_INET6) {
    set_ipv6_v6only(ctx->sock, 0);
    infof(data, "  Trying [%s]:%d...", ctx->ip.remote_ip, ctx->ip.remote_port);
  }
  else
#endif
    infof(data, "  Trying %s:%d...", ctx->ip.remote_ip, ctx->ip.remote_port);

#ifdef USE_IPV6
  is_tcp = (ctx->addr.family == AF_INET
            || ctx->addr.family == AF_INET6) &&
           ctx->addr.socktype == SOCK_STREAM;
#else
  is_tcp = (ctx->addr.family == AF_INET) &&
           ctx->addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, ctx->sock);

  nosigpipe(data, ctx->sock);

  Curl_sndbuf_init(ctx->sock);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, ctx->sock);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, TRUE);
    error = data->set.fsockopt(data->set.sockopt_client,
                               ctx->sock,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, FALSE);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

#ifndef CURL_DISABLE_BINDLOCAL
  /* possibly bind the local end to an IP, interface or port */
  if(ctx->addr.family == AF_INET
#ifdef USE_IPV6
     || ctx->addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, cf->conn, ctx->sock, ctx->addr.family,
                       Curl_ipv6_scope(&ctx->addr.curl_sa_addr));
    if(result) {
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        result = CURLE_COULDNT_CONNECT;
      }
      goto out;
    }
  }
#endif

#ifndef SOCK_NONBLOCK
  /* Set socket non-blocking, must be a non-blocking socket for
   * a non-blocking connect. */
  error = curlx_nonblock(ctx->sock, TRUE);
  if(error < 0) {
    result = CURLE_UNSUPPORTED_PROTOCOL;
    ctx->error = SOCKERRNO;
    goto out;
  }
#else
  if(data->set.fopensocket) {
    /* Set socket non-blocking, must be a non-blocking socket for
     * a non-blocking connect. */
    error = curlx_nonblock(ctx->sock, TRUE);
    if(error < 0) {
      result = CURLE_UNSUPPORTED_PROTOCOL;
      ctx->error = SOCKERRNO;
      goto out;
    }
  }
#endif
  ctx->sock_connected = (ctx->addr.socktype != SOCK_DGRAM);
out:
  if(result) {
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
  }
  else if(isconnected) {
    set_local_ip(cf, data);
    ctx->connected_at = Curl_now();
    cf->connected = TRUE;
  }
  CURL_TRC_CF(data, cf, "cf_socket_open() -> %d, fd=%" FMT_SOCKET_T,
              result, ctx->sock);
  return result;
}